

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int ParseEXRMultipartHeaderFromFile
              (EXRHeader ***exr_headers,int *num_headers,EXRVersion *exr_version,char *filename,
              char **err)

{
  undefined4 in_EAX;
  int iVar1;
  undefined1 auVar2 [16];
  allocator local_89;
  MemoryMappedFile file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  auVar2._0_4_ = -(uint)(exr_headers == (EXRHeader ***)0x0);
  auVar2._4_4_ = -(uint)(num_headers == (int *)0x0);
  auVar2._8_4_ = -(uint)(exr_version == (EXRVersion *)0x0);
  auVar2._12_4_ = -(uint)(filename == (char *)0x0);
  iVar1 = movmskps(in_EAX,auVar2);
  if (iVar1 == 0) {
    MemoryMappedFile::MemoryMappedFile(&file,filename);
    if (file.data == (uchar *)0x0) {
      std::__cxx11::string::string((string *)&local_70,filename,&local_89);
      std::operator+(&local_50,"Cannot read file ",&local_70);
      tinyexr::SetErrorMessage(&local_50,err);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      iVar1 = -7;
    }
    else {
      iVar1 = ParseEXRMultipartHeaderFromMemory
                        (exr_headers,num_headers,exr_version,file.data,file.size,err);
    }
    MemoryMappedFile::~MemoryMappedFile(&file);
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_50,"Invalid argument for ParseEXRMultipartHeaderFromFile()",
               (allocator *)&local_70);
    tinyexr::SetErrorMessage(&local_50,err);
    std::__cxx11::string::~string((string *)&local_50);
    iVar1 = -3;
  }
  return iVar1;
}

Assistant:

int ParseEXRMultipartHeaderFromFile(EXRHeader ***exr_headers, int *num_headers,
                                    const EXRVersion *exr_version,
                                    const char *filename, const char **err) {
  if (exr_headers == NULL || num_headers == NULL || exr_version == NULL ||
      filename == NULL) {
    tinyexr::SetErrorMessage(
        "Invalid argument for ParseEXRMultipartHeaderFromFile()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  MemoryMappedFile file(filename);
  if (!file.valid()) {
    tinyexr::SetErrorMessage("Cannot read file " + std::string(filename), err);
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  return ParseEXRMultipartHeaderFromMemory(
      exr_headers, num_headers, exr_version, file.data, file.size, err);
}